

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void HMAC_finish(uECC_HashContext *hash_context,uint8_t *K,uint8_t *result)

{
  ulong uVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  uVar2 = hash_context->result_size;
  puVar3 = hash_context->tmp + uVar2 * 2;
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    puVar3[uVar1] = K[uVar1] ^ 0x5c;
    uVar2 = hash_context->result_size;
  }
  for (; uVar1 < hash_context->block_size; uVar1 = uVar1 + 1) {
    puVar3[uVar1] = '\\';
  }
  (*hash_context->finish_hash)(hash_context,result);
  (*hash_context->init_hash)(hash_context);
  (*hash_context->update_hash)(hash_context,puVar3,hash_context->block_size);
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
  (*hash_context->finish_hash)(hash_context,result);
  return;
}

Assistant:

static void HMAC_finish(const uECC_HashContext *hash_context,
                        const uint8_t *K,
                        uint8_t *result) {
    uint8_t *pad = hash_context->tmp + 2 * hash_context->result_size;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i)
        pad[i] = K[i] ^ 0x5c;
    for (; i < hash_context->block_size; ++i)
        pad[i] = 0x5c;

    hash_context->finish_hash(hash_context, result);

    hash_context->init_hash(hash_context);
    hash_context->update_hash(hash_context, pad, hash_context->block_size);
    hash_context->update_hash(hash_context, result, hash_context->result_size);
    hash_context->finish_hash(hash_context, result);
}